

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PartsBupOutputter.cpp
# Opt level: O3

Blend __thiscall
PartsBupOutputter::prepareImageInTmp
          (PartsBupOutputter *this,Image *img,Point pos,
          vector<MaskRect,_std::allocator<MaskRect>_> *mask,Image *target)

{
  ushort uVar1;
  Size SVar2;
  pointer __s;
  pointer pCVar3;
  pointer pMVar4;
  Blend BVar5;
  pointer pMVar6;
  long lVar7;
  uint8_t *puVar8;
  long lVar9;
  long lVar10;
  byte bVar11;
  bool bVar12;
  ulong uVar13;
  uint8_t *puVar14;
  vector<MaskRect,_std::allocator<MaskRect>_> local_48;
  
  SVar2 = img->size;
  (this->tmp).size = SVar2;
  std::vector<Color,_std::allocator<Color>_>::resize
            (&(this->tmp).colorData,(long)(SVar2.height * SVar2.width));
  __s = (this->tmp).colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
        super__Vector_impl_data._M_start;
  pCVar3 = (this->tmp).colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (__s != pCVar3) {
    memset(__s,0,((long)pCVar3 + (-4 - (long)__s) & 0xfffffffffffffffcU) + 4);
  }
  std::vector<MaskRect,_std::allocator<MaskRect>_>::vector(&local_48,mask);
  Image::drawOnto(img,&this->tmp,(Point)0x0,&local_48);
  if (local_48.super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  pMVar6 = (mask->super__Vector_base<MaskRect,_std::allocator<MaskRect>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pMVar4 = (mask->super__Vector_base<MaskRect,_std::allocator<MaskRect>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pMVar6 == pMVar4) {
    BVar5 = AlphaBlend;
  }
  else {
    lVar7 = (long)(target->size).width * 4;
    lVar9 = (long)(img->size).width * 4;
    bVar11 = 0;
    bVar12 = false;
    do {
      uVar13 = (ulong)pMVar6->y1;
      if (pMVar6->y1 < pMVar6->y2) {
        uVar1 = pMVar6->x1;
        puVar14 = &(target->colorData).super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
                   super__Vector_impl_data._M_start[(long)pos.x + (ulong)uVar1].a +
                  (((long)pos >> 0x20) + uVar13) * lVar7;
        puVar8 = &(img->colorData).super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar1].a + lVar9 * uVar13;
        do {
          if (uVar1 < pMVar6->x2) {
            lVar10 = 0;
            do {
              if (puVar14[lVar10 * 4] != '\0') {
                if (puVar8[lVar10 * 4] == '\0') {
                  bVar12 = true;
                }
                else if (puVar8[lVar10 * 4] != 0xff) {
                  bVar11 = 1;
                }
              }
              lVar10 = lVar10 + 1;
            } while ((ulong)pMVar6->x2 - (ulong)uVar1 != lVar10);
          }
          uVar13 = uVar13 + 1;
          puVar14 = puVar14 + lVar7;
          puVar8 = puVar8 + lVar9;
        } while (uVar13 != pMVar6->y2);
      }
      pMVar6 = pMVar6 + 1;
    } while (pMVar6 != pMVar4);
    BVar5 = NotPossible;
    if (!bVar12) {
      BVar5 = (uint)bVar11;
    }
  }
  return BVar5;
}

Assistant:

Blend prepareImageInTmp(const Image& img, Point pos, const std::vector<MaskRect>& mask, const Image& target) {
		tmp.fastResize(img.size);
		std::fill(tmp.colorData.begin(), tmp.colorData.end(), Color());
		bool hasPartiallyTransparent = false;
		bool hasFullyTransparent = false;
		img.drawOnto(tmp, {0, 0}, mask);
		for (const auto& section : mask) {
			for (int y = section.y1; y < section.y2; y++) {
				for (int x = section.x1; x < section.x2; x++) {
					Color px = img.pixel(x, y);
					if (target.pixel(pos.x + x, pos.y + y).a == 0) {
						continue;
					}
					if (px.a == 0) {
						hasFullyTransparent = true;
					}
					else if (px.a < 255) {
						hasPartiallyTransparent = true;
					}
				}
			}
		}
		return hasFullyTransparent ? Blend::NotPossible
		     : hasPartiallyTransparent ? Blend::CustomBlend
		     : Blend::AlphaBlend;
	}